

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ancientzip.cpp
# Opt level: O2

int ShrinkLoop(uchar *out,uint outsize,FileReader *In,uint InLeft)

{
  byte *pbVar1;
  uchar uVar2;
  uchar *puVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  byte bVar7;
  byte bVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  unsigned_short uVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  uint uVar22;
  int local_8168;
  int local_8164;
  uint local_8160;
  uchar ReadBuf [256];
  unsigned_short Parent [8192];
  uchar Stack [8192];
  uchar Value [8192];
  
  for (lVar6 = 0; lVar6 != 0x100; lVar6 = lVar6 + 1) {
    Value[lVar6] = (uchar)lVar6;
    Parent[lVar6] = 0x100;
  }
  for (lVar6 = 0x101; lVar6 != 0x2000; lVar6 = lVar6 + 1) {
    Parent[lVar6] = 0x2000;
  }
  uVar22 = 0;
  uVar10 = 0;
  uVar5 = 0;
  for (uVar12 = 0; uVar12 < 9; uVar12 = uVar12 + 8) {
    if (InLeft == 0) {
      InLeft = 0;
      bVar7 = 0;
    }
    else {
      InLeft = InLeft - 1;
      if ((uint)uVar10 < uVar5) {
        pbVar1 = ReadBuf + uVar10;
        uVar10 = (ulong)((uint)uVar10 + 1);
        bVar7 = *pbVar1;
      }
      else {
        uVar5 = (*(In->super_FileReaderBase)._vptr_FileReaderBase[2])(In,ReadBuf,0x100);
        uVar10 = 1;
        bVar7 = ReadBuf[0];
      }
    }
    uVar22 = uVar22 + ((uint)bVar7 << ((byte)uVar12 & 0x1f));
  }
  if (outsize != 0) {
    *out = (uchar)uVar22;
  }
  uVar11 = (uint)(outsize != 0);
  local_8160 = uVar22 & 0x1ff;
  uVar22 = uVar22 >> 9;
  uVar12 = 7;
  local_8164 = 0x100;
  uVar17 = 9;
  local_8168 = -9;
  iVar9 = -0x12;
  do {
    bVar7 = (byte)uVar17;
    uVar14 = ~(-1 << (bVar7 & 0x1f));
    uVar13 = uVar12;
    do {
      while( true ) {
        while( true ) {
          if (outsize <= uVar11) {
            return 0;
          }
          uVar12 = iVar9 + uVar13;
          for (; uVar13 < uVar17; uVar13 = uVar13 + 8) {
            if (InLeft == 0) {
              InLeft = 0;
              bVar8 = 0;
            }
            else {
              InLeft = InLeft - 1;
              if ((uint)uVar10 < uVar5) {
                pbVar1 = ReadBuf + uVar10;
                uVar10 = (ulong)((uint)uVar10 + 1);
                bVar8 = *pbVar1;
              }
              else {
                uVar5 = (*(In->super_FileReaderBase)._vptr_FileReaderBase[2])(In,ReadBuf,0x100);
                uVar10 = 1;
                bVar8 = ReadBuf[0];
              }
            }
            uVar22 = uVar22 + ((uint)bVar8 << ((byte)uVar13 & 0x1f));
            uVar12 = uVar12 + 8;
          }
          uVar15 = uVar22 & uVar14;
          uVar22 = uVar22 >> (bVar7 & 0x1f);
          if (uVar15 == 0x100) break;
          uVar16 = Parent[uVar15];
          uVar12 = uVar15;
          puVar3 = Stack + 0x1fff;
          if (uVar16 == 0x2000) {
            uVar12 = local_8160;
            puVar3 = Stack + 0x1ffe;
          }
          lVar6 = -1;
          lVar20 = 0;
          do {
            lVar18 = lVar20;
            lVar21 = lVar6;
            uVar2 = Value[(int)uVar12];
            puVar3[lVar18] = uVar2;
            uVar12 = Parent[(int)uVar12] & 0x1fff;
            lVar6 = lVar21 + -1;
            lVar20 = lVar18 + -1;
          } while (uVar12 != 0x100);
          if (uVar16 == 0x2000) {
            Stack[0x1fff] = uVar2;
          }
          lVar20 = (long)local_8164;
          lVar6 = 0;
          do {
            lVar4 = lVar6 + 1;
            lVar6 = lVar6 + 1;
          } while (Parent[lVar20 + lVar4] != 0x2000);
          Parent[lVar20 + lVar6] = (unsigned_short)local_8160;
          Value[lVar6 + lVar20] = puVar3[lVar18];
          for (; (uint)(uVar16 == 0x2000) != (uint)lVar21; lVar21 = lVar21 + 1) {
            uVar19 = (ulong)uVar11;
            uVar11 = uVar11 + 1;
            out[uVar19] = puVar3[lVar21 + 1];
          }
          local_8164 = local_8164 + (int)lVar6;
          local_8160 = uVar15;
          uVar13 = uVar13 + local_8168;
        }
        for (uVar13 = uVar13 + local_8168; uVar13 < uVar17; uVar13 = uVar13 + 8) {
          if (InLeft == 0) {
            InLeft = 0;
            bVar8 = 0;
          }
          else {
            InLeft = InLeft - 1;
            if ((uint)uVar10 < uVar5) {
              pbVar1 = ReadBuf + uVar10;
              uVar10 = (ulong)((uint)uVar10 + 1);
              bVar8 = *pbVar1;
            }
            else {
              uVar5 = (*(In->super_FileReaderBase)._vptr_FileReaderBase[2])(In,ReadBuf,0x100);
              uVar10 = 1;
              bVar8 = ReadBuf[0];
            }
          }
          uVar22 = uVar22 + ((uint)bVar8 << ((byte)uVar13 & 0x1f));
          uVar12 = uVar12 + 8;
        }
        uVar15 = uVar22 & uVar14;
        uVar22 = uVar22 >> (bVar7 & 0x1f);
        uVar13 = uVar12;
        if (uVar15 != 2) break;
        for (lVar6 = 0x101; lVar6 != 0x2000; lVar6 = lVar6 + 1) {
          if (0x100 < (ushort)(Parent[lVar6] & 0x1fff)) {
            pbVar1 = (byte *)((long)Parent + (ulong)(Parent[lVar6] & 0x1fff) * 2 + 1);
            *pbVar1 = *pbVar1 | 0x40;
          }
        }
        for (lVar6 = 0x101; lVar6 != 0x2000; lVar6 = lVar6 + 1) {
          uVar16 = Parent[lVar6] & 0xbfff;
          if ((Parent[lVar6] >> 0xe & 1) == 0) {
            uVar16 = 0x2000;
          }
          Parent[lVar6] = uVar16;
        }
        local_8164 = 0x100;
      }
    } while (uVar15 != 1);
    uVar17 = uVar17 + 1;
    local_8168 = local_8168 + -1;
    iVar9 = iVar9 + -2;
  } while( true );
}

Assistant:

int ShrinkLoop(unsigned char *out, unsigned int outsize,
			   FileReader *In, unsigned int InLeft)
{
	unsigned char ReadBuf[256];
	unsigned short Parent[HSIZE];
	unsigned char Value[HSIZE], Stack[HSIZE];
	unsigned char *newstr;
	int len;
	int KwKwK, codesize = 9;	/* start at 9 bits/code */
	int code, oldcode, freecode, curcode;
	unsigned int Bits = 0, Hold = 0;
	unsigned int size = 0;
	unsigned int bs = 0, be = 0;

	freecode = BOGUSCODE;
	for (code = 0; code < BOGUSCODE; code++)
	{
		Value[code] = code;
		Parent[code] = BOGUSCODE;
	}
	for (code = BOGUSCODE+1; code < HSIZE; code++)
		Parent[code] = FREE_CODE;

	READBITS(oldcode, codesize);
	if (size < outsize) {
		out[size++] = oldcode;
	}

	while (size < outsize)
	{
		READBITS(code, codesize);
		if (code == BOGUSCODE) {	/* possible to have consecutive escapes? */
			READBITS(code, codesize);
			if (code == 1) {
				codesize++;
			} else if (code == 2) {
				/* clear leafs (nodes with no children) */
				/* first loop:  mark each parent as such */
				for (code = BOGUSCODE+1;  code < HSIZE;  ++code) {
					curcode = (Parent[code] & CODE_MASK);

					if (curcode > BOGUSCODE)
						Parent[curcode] |= HAS_CHILD;		/* set parent's child-bit */
				}

				/* second loop:  clear all nodes *not* marked as parents; reset flag bits */
				for (code = BOGUSCODE+1;  code < HSIZE;  ++code) {
					if (Parent[code] & HAS_CHILD) {		/* just clear child-bit */
						Parent[code] &= ~HAS_CHILD;
					} else {							/* leaf:  lose it */
						Parent[code] = FREE_CODE;
					}
				}
				freecode = BOGUSCODE;
			}
			continue;
		}

		newstr = &Stack[HSIZE-1];
		curcode = code;

		if (Parent[curcode] == FREE_CODE) {
			KwKwK = 1;
			newstr--;	/* last character will be same as first character */
			curcode = oldcode;
			len = 1;
		} else {
			KwKwK = 0;
			len = 0;
		}

		do {
			*newstr-- = Value[curcode];
			len++;
			curcode = (Parent[curcode] & CODE_MASK);
		} while (curcode != BOGUSCODE);

		newstr++;
		if (KwKwK) {
			Stack[HSIZE-1] = *newstr;
		}

		do {
			freecode++;
		} while (Parent[freecode] != FREE_CODE);

		Parent[freecode] = oldcode;
		Value[freecode] = *newstr;
		oldcode = code;

		while (len--) {
			out[size++] = *newstr++;
		}
	}
	return 0;
}